

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_TextureMapping::MappingCRC(ON_TextureMapping *this)

{
  bool bVar1;
  ON__UINT32 OVar2;
  element_type *this_00;
  element_type *peVar3;
  MappingCRCCache *this_01;
  ON__UINT32 local_34;
  undefined1 auStack_30 [4];
  ON__UINT32 mapping_crc;
  ON_UserData *local_20;
  MappingCRCCache *pUD;
  ON_TextureMapping *pOStack_10;
  ON__UINT32 crc32;
  ON_TextureMapping *this_local;
  
  pUD._4_4_ = 0x12345678;
  pOStack_10 = this;
  pUD._4_4_ = ON_CRC32(0x12345678,4,&this->m_type);
  if (this->m_type == srfp_mapping) {
    pUD._4_4_ = pUD._4_4_ + 1;
  }
  else {
    pUD._4_4_ = ON_CRC32(pUD._4_4_,4,&this->m_projection);
    pUD._4_4_ = ON_CRC32(pUD._4_4_,4,&this->m_texture_space);
    pUD._4_4_ = ON_CRC32(pUD._4_4_,1,&this->m_bCapped);
    pUD._4_4_ = ON_CRC32(pUD._4_4_,0x80,&this->m_Pxyz);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_mapping_primitive);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<const_ON_Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_ON_Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_mapping_primitive);
      _auStack_30 = ON_ClassId::Uuid(&MappingCRCCache::m_MappingCRCCache_class_rtti);
      local_20 = ON_Object::GetUserData(this_00,(ON_UUID *)auStack_30);
      if (local_20 == (ON_UserData *)0x0) {
        peVar3 = std::__shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->m_mapping_primitive).
                             super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>);
        local_34 = ::MappingCRC(peVar3);
        peVar3 = std::__shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->m_mapping_primitive).
                             super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>);
        this_01 = (MappingCRCCache *)operator_new(0xd0);
        MappingCRCCache::MappingCRCCache(this_01,local_34);
        ON_Object::AttachUserData(peVar3,(ON_UserData *)this_01);
        pUD._4_4_ = ON_CRC32(pUD._4_4_,4,&local_34);
      }
      else {
        pUD._4_4_ = ON_CRC32(pUD._4_4_,4,local_20 + 1);
      }
    }
  }
  OVar2 = ON_CRC32(pUD._4_4_,0x80,&this->m_uvw);
  return OVar2;
}

Assistant:

ON__UINT32 ON_TextureMapping::MappingCRC() const
{
  // include any member that can change values returned by Evaluate
  ON__UINT32 crc32 = 0x12345678;
  crc32 = ON_CRC32(crc32,sizeof(m_type),&m_type);
  if ( ON_TextureMapping::TYPE::srfp_mapping != m_type )
  {
    // As of 21 June 2006 m_Pxyz cannot effect ON_TextureMapping::TYPE::srfp_mapping,
    // so it shouldn't be included in the CRC for srfp_mappings.
    crc32 = ON_CRC32(crc32,sizeof(m_projection),    &m_projection);
    crc32 = ON_CRC32(crc32,sizeof(m_texture_space), &m_texture_space);
    crc32 = ON_CRC32(crc32,sizeof(m_bCapped),		    &m_bCapped);
    crc32 = ON_CRC32(crc32,sizeof(m_Pxyz),          &m_Pxyz);
    // do not include m_Nxyz here - it won't help and may hurt

    if (m_mapping_primitive)
    {
      const auto* pUD = static_cast<MappingCRCCache*>(m_mapping_primitive->GetUserData(ON_CLASS_ID(MappingCRCCache)));
      if (pUD)
      {
        crc32 = ON_CRC32(crc32, sizeof(MappingCRCCache::m_mapping_crc), &pUD->m_mapping_crc);
      }
      else
      {
        //Existing files.
        const auto mapping_crc = ::MappingCRC(m_mapping_primitive.get());
        const_cast<ON_Object*>(m_mapping_primitive.get())->AttachUserData(new MappingCRCCache(mapping_crc));
        crc32 = ON_CRC32(crc32, sizeof(mapping_crc), &mapping_crc);
      }
    }
  }
  else
  {
    // Jussi, Aug 18 2022, RH-69752: Surface mapping uvw transform has changed.
    // Changing crc makes sure existing models will show the correct mapping.
    crc32++;
  }

  crc32 = ON_CRC32(crc32,sizeof(m_uvw), &m_uvw);
  return crc32;
}